

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_EXT_pixel_transform(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_pixel_transform != 0) {
    glad_glPixelTransformParameteriEXT =
         (PFNGLPIXELTRANSFORMPARAMETERIEXTPROC)(*load)("glPixelTransformParameteriEXT");
    glad_glPixelTransformParameterfEXT =
         (PFNGLPIXELTRANSFORMPARAMETERFEXTPROC)(*load)("glPixelTransformParameterfEXT");
    glad_glPixelTransformParameterivEXT =
         (PFNGLPIXELTRANSFORMPARAMETERIVEXTPROC)(*load)("glPixelTransformParameterivEXT");
    glad_glPixelTransformParameterfvEXT =
         (PFNGLPIXELTRANSFORMPARAMETERFVEXTPROC)(*load)("glPixelTransformParameterfvEXT");
    glad_glGetPixelTransformParameterivEXT =
         (PFNGLGETPIXELTRANSFORMPARAMETERIVEXTPROC)(*load)("glGetPixelTransformParameterivEXT");
    glad_glGetPixelTransformParameterfvEXT =
         (PFNGLGETPIXELTRANSFORMPARAMETERFVEXTPROC)(*load)("glGetPixelTransformParameterfvEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_pixel_transform(GLADloadproc load) {
	if(!GLAD_GL_EXT_pixel_transform) return;
	glad_glPixelTransformParameteriEXT = (PFNGLPIXELTRANSFORMPARAMETERIEXTPROC)load("glPixelTransformParameteriEXT");
	glad_glPixelTransformParameterfEXT = (PFNGLPIXELTRANSFORMPARAMETERFEXTPROC)load("glPixelTransformParameterfEXT");
	glad_glPixelTransformParameterivEXT = (PFNGLPIXELTRANSFORMPARAMETERIVEXTPROC)load("glPixelTransformParameterivEXT");
	glad_glPixelTransformParameterfvEXT = (PFNGLPIXELTRANSFORMPARAMETERFVEXTPROC)load("glPixelTransformParameterfvEXT");
	glad_glGetPixelTransformParameterivEXT = (PFNGLGETPIXELTRANSFORMPARAMETERIVEXTPROC)load("glGetPixelTransformParameterivEXT");
	glad_glGetPixelTransformParameterfvEXT = (PFNGLGETPIXELTRANSFORMPARAMETERFVEXTPROC)load("glGetPixelTransformParameterfvEXT");
}